

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

format_arg * __thiscall
duckdb_fmt::v6::internal::
get_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>
          (format_arg *__return_storage_ptr__,internal *this,
          basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>
          *ctx,int id)

{
  long lVar1;
  uint uVar2;
  long *plVar3;
  uint uVar4;
  long *plVar5;
  ulong uVar6;
  uint __val;
  uint uVar7;
  string __str;
  long *local_d0;
  long local_c0;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  uVar7 = (uint)ctx;
  basic_format_args<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
  ::get(__return_storage_ptr__,
        (basic_format_args<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
         *)(this + 8),uVar7);
  if (__return_storage_ptr__->type_ != none_type) {
    return __return_storage_ptr__;
  }
  __val = -uVar7;
  if (0 < (int)uVar7) {
    __val = uVar7;
  }
  uVar7 = 1;
  if (9 < __val) {
    uVar6 = (ulong)__val;
    uVar2 = 4;
    do {
      uVar7 = uVar2;
      uVar4 = (uint)uVar6;
      if (uVar4 < 100) {
        uVar7 = uVar7 - 2;
        goto LAB_003b1cff;
      }
      if (uVar4 < 1000) {
        uVar7 = uVar7 - 1;
        goto LAB_003b1cff;
      }
      if (uVar4 < 10000) goto LAB_003b1cff;
      uVar6 = uVar6 / 10000;
      uVar2 = uVar7 + 4;
    } while (99999 < uVar4);
    uVar7 = uVar7 + 1;
  }
LAB_003b1cff:
  uVar6 = (ulong)ctx >> 0x1f & 1;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)uVar7 + (char)uVar6);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_50[0] + uVar6,uVar7,__val);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x13526ce);
  local_b0 = (long *)*plVar3;
  plVar5 = plVar3 + 2;
  if (local_b0 == plVar5) {
    local_a0 = *plVar5;
    lStack_98 = plVar3[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar5;
  }
  local_a8 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_d0 = (long *)*plVar3;
  plVar5 = plVar3 + 2;
  if (local_d0 == plVar5) {
    local_c0 = *plVar5;
    uStack_b8 = (undefined4)plVar3[3];
    uStack_b4 = *(undefined4 *)((long)plVar3 + 0x1c);
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar5;
  }
  lVar1 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_d0,lVar1 + (long)local_d0);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_90,local_90 + local_88);
  error_handler::on_error((error_handler *)(this + 0x18),&local_70);
}

Assistant:

FMT_CONSTEXPR typename Context::format_arg get_arg(Context& ctx, int id) {
  auto arg = ctx.arg(id);
  if (!arg) ctx.on_error("Argument index \"" + std::to_string(id) + "\" out of range");
  return arg;
}